

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O3

bool trimesh::is_t_lt_abs_diff(mscomplex_t *msc,double t,int i)

{
  pointer ppVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this;
  ulong uVar4;
  ulong uVar5;
  fn_t fVar6;
  fn_t fVar7;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (-1 < i) {
    uVar5 = (ulong)(uint)i;
    ppVar1 = (msc->m_canc_list).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(msc->m_canc_list).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3;
    if (uVar5 < uVar4 + 1) {
      if (uVar4 == uVar5) {
        bVar2 = false;
      }
      else {
        fVar6 = mscomplex_t::fn(msc,ppVar1[uVar5].first);
        fVar7 = mscomplex_t::fn(msc,(msc->m_canc_list).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].second);
        bVar2 = t < ABS(fVar6 - fVar7);
      }
      return bVar2;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed to assert condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"is_in_range(i,0,msc->m_canc_list.size()+1)",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
             ,0x69);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"is_t_lt_abs_diff",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,",",1);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,0x243);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \n ",4);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_t_lt_abs_diff(const mscomplex_t * msc, double t,int i)
{
  ASSERT(is_in_range(i,0,msc->m_canc_list.size()+1));

  if( i == msc->m_canc_list.size())
    return false;
  else
    return t < std::abs
        (msc->fn(msc->m_canc_list[i].first) -
         msc->fn(msc->m_canc_list[i].second));
}